

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setMinimumTime(QDateTimeEdit *this,QTime min)

{
  long lVar1;
  QDateTimeEditPrivate *dt;
  ulong uVar2;
  QTime in_ESI;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTimeEditPrivate *this_00;
  QDate in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  dt = d_func((QDateTimeEdit *)0x5594ee);
  uVar2 = QTime::isValid();
  if ((uVar2 & 1) != 0) {
    ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue(in_RDI,in_stack_ffffffffffffffe8,in_ESI);
    setMinimumDateTime((QDateTimeEdit *)this_00,(QDateTime *)dt);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setMinimumTime(QTime min)
{
    Q_D(QDateTimeEdit);
    if (min.isValid())
        setMinimumDateTime(d->dateTimeValue(d->minimum.toDate(), min));
}